

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPhase.hpp
# Opt level: O0

bool __thiscall
qclab::qgates::CPhase<std::complex<float>_>::equals
          (CPhase<std::complex<float>_> *this,QObject<std::complex<float>_> *other)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  angle_type *this_00;
  angle_type *other_00;
  bool local_59;
  CPhase<std::complex<float>_> *local_40;
  CP *p;
  QObject<std::complex<float>_> *other_local;
  CPhase<std::complex<float>_> *this_local;
  
  if (other == (QObject<std::complex<float>_> *)0x0) {
    local_40 = (CPhase<std::complex<float>_> *)0x0;
  }
  else {
    local_40 = (CPhase<std::complex<float>_> *)
               __dynamic_cast(other,&QObject<std::complex<float>>::typeinfo,
                              &CPhase<std::complex<float>>::typeinfo,0);
  }
  if (local_40 == (CPhase<std::complex<float>_> *)0x0) {
    return false;
  }
  this_00 = angle(local_40);
  other_00 = angle(this);
  bVar1 = QAngle<float>::operator!=(this_00,other_00);
  if (bVar1) {
    return false;
  }
  iVar2 = QControlledGate2<std::complex<float>_>::controlState
                    (&local_40->super_QControlledGate2<std::complex<float>_>);
  iVar3 = QControlledGate2<std::complex<float>_>::controlState
                    (&this->super_QControlledGate2<std::complex<float>_>);
  if (iVar2 == iVar3) {
    iVar2 = QControlledGate2<std::complex<float>_>::control
                      (&local_40->super_QControlledGate2<std::complex<float>_>);
    iVar3 = (*(local_40->super_QControlledGate2<std::complex<float>_>).
              super_QGate2<std::complex<float>_>.super_QObject<std::complex<float>_>._vptr_QObject
              [0xf])();
    if (iVar2 < iVar3) {
      iVar2 = QControlledGate2<std::complex<float>_>::control
                        (&this->super_QControlledGate2<std::complex<float>_>);
      iVar3 = (*(this->super_QControlledGate2<std::complex<float>_>).
                super_QGate2<std::complex<float>_>.super_QObject<std::complex<float>_>._vptr_QObject
                [0xf])();
      if (iVar2 < iVar3) {
        return true;
      }
    }
    iVar2 = QControlledGate2<std::complex<float>_>::control
                      (&local_40->super_QControlledGate2<std::complex<float>_>);
    iVar3 = (*(local_40->super_QControlledGate2<std::complex<float>_>).
              super_QGate2<std::complex<float>_>.super_QObject<std::complex<float>_>._vptr_QObject
              [0xf])();
    local_59 = false;
    if (iVar3 < iVar2) {
      iVar2 = QControlledGate2<std::complex<float>_>::control
                        (&this->super_QControlledGate2<std::complex<float>_>);
      iVar3 = (*(this->super_QControlledGate2<std::complex<float>_>).
                super_QGate2<std::complex<float>_>.super_QObject<std::complex<float>_>._vptr_QObject
                [0xf])();
      local_59 = iVar3 < iVar2;
    }
    return local_59;
  }
  return false;
}

Assistant:

inline bool equals( const QObject< T >& other ) const override {
          using CP = CPhase< T > ;
          if ( const CP* p = dynamic_cast< const CP* >( &other ) ) {
            if ( p->angle() != this->angle() ) return false ;
            if ( p->controlState() != this->controlState() ) return false ;
            return ( ( p->control() < p->target() ) &&
                     ( this->control() < this->target() ) ) ||
                   ( ( p->control() > p->target() ) &&
                     ( this->control() > this->target() ) ) ;
          }
          return false ;
        }